

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::set(ParamDict *this,int id,Mat *v)

{
  this->params[id].loaded = 1;
  Mat::operator=(&this->params[id].v,v);
  return;
}

Assistant:

void ParamDict::set(int id, const Mat& v)
{
    params[id].loaded = 1;
    params[id].v = v;
}